

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void progressStart(void)

{
  int iVar1;
  
  LOCK();
  embree::progressDots = 0;
  UNLOCK();
  iVar1 = embree::getTerminalWidth();
  embree::progressWidth = 3;
  if (3 < iVar1) {
    embree::progressWidth = iVar1;
  }
  std::operator<<((ostream *)&std::cout,"[");
  std::ostream::flush();
  return;
}

Assistant:

void progressStart()
  {
    progressDots = 0;
    progressWidth = max(3,getTerminalWidth());
    std::cout << "[" << std::flush;
  }